

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_mime_parser.h
# Opt level: O0

int http_mime_parser_init(http_mime_parser_s *parser,char *content_type,size_t len)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  char *local_48;
  char *cut;
  size_t local_38;
  undefined8 local_30;
  ulong local_28;
  size_t len_local;
  char *content_type_local;
  http_mime_parser_s *parser_local;
  
  local_28 = len;
  len_local = (size_t)content_type;
  content_type_local = (char *)parser;
  memset(&cut,0,0x18);
  parser->boundary = cut;
  parser->boundary_len = local_38;
  parser->in_obj = (undefined1)local_30;
  parser->done = local_30._1_1_;
  parser->error = local_30._2_1_;
  *(undefined5 *)&parser->field_0x13 = local_30._3_5_;
  if ((0xd < local_28) && (iVar1 = strncasecmp("multipart/form",(char *)len_local,0xe), iVar1 == 0))
  {
    local_48 = (char *)memchr((void *)len_local,0x3b,local_28);
    while( true ) {
      if (local_48 == (char *)0x0) {
        return -1;
      }
      local_48 = (char *)((long)local_48 + 1);
      local_28 = local_28 - ((long)local_48 - len_local);
      while( true ) {
        bVar3 = false;
        if (local_28 != 0) {
          bVar3 = *local_48 == ' ';
        }
        if (!bVar3) break;
        local_28 = local_28 - 1;
        local_48 = local_48 + 1;
      }
      if (local_28 < 10) break;
      iVar1 = strncasecmp("boundary=",local_48,9);
      if (iVar1 == 0) {
        len_local = (size_t)(local_48 + 9);
        local_28 = local_28 - 9;
        *(size_t *)content_type_local = len_local;
        pvVar2 = memchr((void *)len_local,0x3b,local_28);
        if (pvVar2 == (void *)0x0) {
          *(ulong *)(content_type_local + 8) = local_28;
        }
        else {
          *(size_t *)(content_type_local + 8) = (long)pvVar2 - len_local;
        }
        return 0;
      }
      len_local = (size_t)local_48;
      local_48 = (char *)memchr(local_48,0x3b,local_28);
    }
    return -1;
  }
  return -1;
}

Assistant:

static int http_mime_parser_init(http_mime_parser_s *parser, char *content_type,
                                 size_t len) {
  *parser = (http_mime_parser_s){.done = 0};
  if (len < 14 || strncasecmp("multipart/form", content_type, 14))
    return -1;
  char *cut = memchr(content_type, ';', len);
  while (cut) {
    ++cut;
    len -= (size_t)(cut - content_type);
    while (len && cut[0] == ' ') {
      --len;
      ++cut;
    }
    if (len <= 9)
      return -1;
    if (strncasecmp("boundary=", cut, 9)) {
      content_type = cut;
      cut = memchr(cut, ';', len);
      continue;
    }
    cut += 9;
    len -= 9;
    content_type = cut;
    parser->boundary = content_type;
    if ((cut = memchr(content_type, ';', len)))
      parser->boundary_len = (size_t)(cut - content_type);
    else
      parser->boundary_len = len;
    return 0;
  }
  return -1;
}